

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TimerQueue.cpp
# Opt level: O0

TimerHolder __thiscall
Liby::TimerQueue::insert(TimerQueue *this,Timestamp *timeout,BasicHandler *handler)

{
  bool bVar1;
  BasicHandler *in_RCX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  TimerHolder TVar3;
  undefined1 local_78 [8];
  WeakTimerHolder weak_holder;
  BasicHandler *handler_local;
  Timestamp *timeout_local;
  TimerQueue *this_local;
  TimerHolder *holder;
  
  weak_holder.weakTimerPtr_.super___weak_ptr<Liby::Timer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi._7_1_ = 0;
  TimerHolder::TimerHolder((TimerHolder *)this,(Timestamp *)handler,in_RCX);
  WeakTimerHolder::WeakTimerHolder((WeakTimerHolder *)local_78,(TimerHolder *)this);
  bVar1 = BinaryHeap<Liby::WeakTimerHolder>::empty
                    ((BinaryHeap<Liby::WeakTimerHolder> *)&timeout[2].tv_.tv_usec);
  if (bVar1) {
    updateTimerfd((TimerQueue *)timeout,(Timestamp *)handler);
  }
  BinaryHeap<Liby::WeakTimerHolder>::insert
            ((BinaryHeap<Liby::WeakTimerHolder> *)&timeout[2].tv_.tv_usec,
             (const_reference_type)local_78);
  weak_holder.weakTimerPtr_.super___weak_ptr<Liby::Timer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi._7_1_ = 1;
  WeakTimerHolder::~WeakTimerHolder((WeakTimerHolder *)local_78);
  _Var2._M_pi = extraout_RDX;
  if ((weak_holder.weakTimerPtr_.super___weak_ptr<Liby::Timer,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi._7_1_ & 1) == 0) {
    TimerHolder::~TimerHolder((TimerHolder *)this);
    _Var2._M_pi = extraout_RDX_00;
  }
  TVar3.timerPtr_.super___shared_ptr<Liby::Timer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var2._M_pi;
  TVar3.timerPtr_.super___shared_ptr<Liby::Timer,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (TimerHolder)TVar3.timerPtr_.super___shared_ptr<Liby::Timer,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

TimerHolder TimerQueue::insert(const Timestamp &timeout,
                               const BasicHandler &handler) {
    TimerHolder holder(timeout, handler);
    WeakTimerHolder weak_holder(holder);

    if (queue_.empty()) {
        updateTimerfd(timeout);
    }

    queue_.insert(weak_holder);
    return holder;
}